

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.cpp
# Opt level: O0

ostream * argo::operator<<(ostream *stream,pointer *p)

{
  bool bVar1;
  type_t tVar2;
  list<argo::pointer::token,_std::allocator<argo::pointer::token>_> *this;
  reference this_00;
  string *psVar3;
  size_t sVar4;
  token *t;
  const_iterator __end1;
  const_iterator __begin1;
  list<argo::pointer::token,_std::allocator<argo::pointer::token>_> *__range1;
  pointer *p_local;
  ostream *stream_local;
  
  this = pointer::get_path_abi_cxx11_(p);
  __end1 = std::__cxx11::list<argo::pointer::token,_std::allocator<argo::pointer::token>_>::begin
                     (this);
  t = (token *)std::__cxx11::list<argo::pointer::token,_std::allocator<argo::pointer::token>_>::end
                         (this);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&t), bVar1) {
    this_00 = std::_List_const_iterator<argo::pointer::token>::operator*(&__end1);
    std::operator<<(stream,"/");
    tVar2 = pointer::token::get_type(this_00);
    if (tVar2 == object_e) {
      psVar3 = pointer::token::get_name_abi_cxx11_(this_00);
      std::operator<<(stream,(string *)psVar3);
    }
    else {
      tVar2 = pointer::token::get_type(this_00);
      if (tVar2 == array_e) {
        sVar4 = pointer::token::get_index(this_00);
        std::ostream::operator<<(stream,sVar4);
      }
    }
    std::_List_const_iterator<argo::pointer::token>::operator++(&__end1);
  }
  return stream;
}

Assistant:

ostream &NAMESPACE::operator<<(ostream &stream, const pointer &p)
{
    for (auto &t : p.get_path())
    {
        stream << "/";
        if (t.get_type() == pointer::token::object_e)
        {
            stream << t.get_name();
        }
        else if (t.get_type() == pointer::token::array_e)
        {
            stream << t.get_index();
        }
    }

    return stream;
}